

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

void find_trap(trap *trap)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  uint local_1c;
  boolean cleared;
  int tt;
  trap *trap_local;
  
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_0017f2d7:
    local_1c = (uint)(trap->field_0x8 & 0x1f);
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar2 = dmgtype(youmonst.data,0x24);
      if (bVar2 != '\0') goto LAB_0017f2d7;
    }
    iVar3 = display_rng(0x18);
    local_1c = iVar3 + 1;
  }
  bVar1 = false;
  trap->field_0x8 = trap->field_0x8 & 0xdf | 0x20;
  exercise(2,'\x01');
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    newsym((int)trap->tx,(int)trap->ty);
  }
  else {
    feel_location(trap->tx,trap->ty);
  }
  if (((*(uint *)(level->locations[trap->tx] + trap->ty) >> 0xb & 0x3ff) != 0) ||
     ((*(uint *)&level->locations[trap->tx][trap->ty].field_0x6 >> 3 & 1) != 0)) {
    cls();
    map_trap(trap,1);
    display_self();
    bVar1 = true;
  }
  pcVar4 = an(trapexplain[(int)(local_1c - 1)]);
  pline("You find %s.",pcVar4);
  if (bVar1) {
    (*windowprocs.win_pause)(P_MAP);
    doredraw();
  }
  return;
}

Assistant:

void find_trap(struct trap *trap)
{
    int tt = what_trap(trap->ttyp);
    boolean cleared = FALSE;

    trap->tseen = 1;
    exercise(A_WIS, TRUE);
    if (Blind)
	feel_location(trap->tx, trap->ty);
    else
	newsym(trap->tx, trap->ty);

    if (level->locations[trap->tx][trap->ty].mem_obj ||
	level->locations[trap->tx][trap->ty].mem_invis) {
    	/* There's too much clutter to see your find otherwise */
	cls();
	map_trap(trap, 1);
	display_self();
	cleared = TRUE;
    }

    pline("You find %s.", an(trapexplain[tt-1]));

    if (cleared) {
	win_pause_output(P_MAP);	/* wait */
	doredraw();
    }
}